

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
mjs::parser::syntax_error
          (parser *this,char *function,int line,source_extend *extend,wstring_view message)

{
  wostream *pwVar1;
  runtime_error *this_00;
  wchar_t *pwVar2;
  undefined4 in_register_00000014;
  long *plVar3;
  wstring_view in;
  wostringstream oss;
  wstring local_1e8;
  ulong local_1c8;
  wstring_view *local_1c0;
  wostringstream local_1a8 [376];
  
  plVar3 = (long *)CONCAT44(in_register_00000014,line);
  std::__cxx11::wostringstream::wostringstream(local_1a8);
  pwVar1 = std::operator<<((wostream *)local_1a8,"Syntax error in ");
  pwVar1 = std::operator<<(pwVar1,(char *)this);
  pwVar1 = std::operator<<(pwVar1," line ");
  pwVar1 = (wostream *)std::wostream::operator<<((wostream *)pwVar1,(int)function);
  pwVar1 = std::operator<<(pwVar1," at \"");
  pwVar2 = (wchar_t *)(ulong)*(uint *)(plVar3 + 2);
  local_1c0 = (wstring_view *)((long)pwVar2 * 4 + *(long *)(*plVar3 + 0x28));
  local_1c8 = (ulong)(*(int *)((long)plVar3 + 0x14) - *(uint *)(plVar3 + 2));
  cpp_quote_abi_cxx11_(&local_1e8,(mjs *)&local_1c8,local_1c0);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  pwVar1 = std::operator<<(pwVar1,"\": ");
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            (pwVar1,(wchar_t *)message._M_len,(long)extend);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity * 4 + 4);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::wstringbuf::str();
  in._M_str = pwVar2;
  in._M_len = local_1c8;
  unicode::utf16_to_utf8_abi_cxx11_((string *)&local_1e8,(unicode *)local_1c0,in);
  std::runtime_error::runtime_error(this_00,(string *)&local_1e8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] static void syntax_error(const char* function, int line, const source_extend& extend, const std::wstring_view message) {
        std::wostringstream oss;
        oss << "Syntax error in " << function  << " line " << line << " at \"" << cpp_quote(extend.source_view()) << "\": " << message;
        throw std::runtime_error(unicode::utf16_to_utf8(oss.str()));
    }